

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

int __thiscall
CLayer::GetNetInOverFlowBoundary
          (CLayer *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pNetList)

{
  CBoundary *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference ppCVar4;
  int *piVar5;
  size_type sVar6;
  int local_b0;
  CNet *local_80;
  CNet *local_78;
  CNet *local_70 [3];
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_58;
  iterator end_1;
  iterator itrw;
  CBoundary *pBoundary;
  vector<CNet_*,_std::allocator<CNet_*>_> NetList;
  iterator end;
  iterator itr;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  *pNetList_local;
  CLayer *this_local;
  
  end = std::
        multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
        ::begin(&this->m_CBoundaryBucket);
  NetList.super__Vector_base<CNet_*,_std::allocator<CNet_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
                ::end(&this->m_CBoundaryBucket);
  while( true ) {
    bVar1 = std::operator!=(&end,(_Self *)&NetList.
                                           super__Vector_base<CNet_*,_std::allocator<CNet_*>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<CNet_*,_std::allocator<CNet_*>_>::vector
              ((vector<CNet_*,_std::allocator<CNet_*>_> *)&pBoundary);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>::operator->(&end);
    this_00 = ppVar3->second;
    end_1 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this_00->m_Wire);
    local_58._M_current =
         (CWire **)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this_00->m_Wire);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&end_1,&local_58);
      if (!bVar1) break;
      iVar2 = CBoundary::GetCongestion(this_00);
      ppCVar4 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end_1);
      local_70[0] = CWire::GetParent(*ppCVar4);
      piVar5 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[](pNetList,(key_type *)local_70);
      if (*piVar5 < iVar2) {
        local_b0 = CBoundary::GetCongestion(this_00);
      }
      else {
        ppCVar4 = __gnu_cxx::
                  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                  operator*(&end_1);
        local_78 = CWire::GetParent(*ppCVar4);
        piVar5 = __gnu_cxx::
                 hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::operator[](pNetList,(key_type *)&local_78);
        local_b0 = *piVar5;
      }
      ppCVar4 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end_1);
      local_80 = CWire::GetParent(*ppCVar4);
      piVar5 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[](pNetList,(key_type *)&local_80);
      *piVar5 = local_b0;
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end_1);
    }
    std::vector<CNet_*,_std::allocator<CNet_*>_>::~vector
              ((vector<CNet_*,_std::allocator<CNet_*>_> *)&pBoundary);
    std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>::operator++(&end);
  }
  sVar6 = __gnu_cxx::
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          ::size(pNetList);
  return (int)sVar6;
}

Assistant:

int CLayer::GetNetInOverFlowBoundary(hash_map<ADDRESS,int>* pNetList)
{
	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		vector<CNet*>	NetList;
		CBoundary*	pBoundary	=	itr->second;

		for(vector<CWire*>::iterator itrw=pBoundary->m_Wire.begin(),end=pBoundary->m_Wire.end();itrw!=end;++itrw)
		{
			(*pNetList)[(ADDRESS)(*itrw)->GetParent()]	=	MAX(pBoundary->GetCongestion(),(*pNetList)[(ADDRESS)(*itrw)->GetParent()]);
		}
	}

	return	pNetList->size();
}